

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O1

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::AssignNewResultIds
          (LoopUnrollerUtilsImpl *this,BasicBlock *basic_block)

{
  IRContext *pIVar1;
  DefUseManager *this_00;
  Instruction *pIVar2;
  array<signed_char,_4UL> aVar3;
  uint32_t uVar4;
  PodType PVar5;
  array<signed_char,_4UL> *paVar6;
  mapped_type *pmVar7;
  mapped_type *ppIVar8;
  Instruction *pIVar9;
  uint32_t uVar10;
  Instruction *line;
  Instruction *pIVar11;
  Instruction *inst;
  Instruction *pIVar12;
  string message;
  uint32_t old_id;
  size_type __dnew;
  undefined1 local_90 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_70;
  uint32_t local_64;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_60;
  spv_position_t local_58;
  LoopUnrollerUtilsImpl *local_40;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_38;
  
  pIVar1 = this->context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  this_00 = (pIVar1->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  pIVar1 = this->context_;
  aVar3._M_elems =
       (_Type)Module::TakeNextIdBound
                        ((pIVar1->module_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                         .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((aVar3._M_elems == (_Type)0x0) &&
     ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_90._0_8_ = local_90 + 0x10;
    local_58.line._0_4_ = (array<signed_char,_4UL>)0x25;
    local_58.line._4_4_ = (array<signed_char,_4UL>)0x0;
    local_90._0_8_ = std::__cxx11::string::_M_create((ulong *)local_90,(ulong)&local_58);
    local_90._16_8_ = local_58.line;
    *(undefined8 *)local_90._0_8_ = 0x667265766f204449;
    *(undefined8 *)(local_90._0_8_ + 8) = 0x797254202e776f6c;
    *(undefined8 *)(local_90._0_8_ + 0x10) = 0x676e696e6e757220;
    *(undefined8 *)(local_90._0_8_ + 0x18) = 0x746361706d6f6320;
    builtin_strncpy((char *)(local_90._0_8_ + 0x1d),"act-ids.",8);
    local_90._8_8_ = local_58.line;
    *(char *)(local_90._0_8_ + local_58.line) = '\0';
    local_58.line = 0;
    local_58.column = 0;
    local_58.index = 0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",&local_58,(char *)local_90._0_8_);
    if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
      operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
    }
  }
  local_60 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&(this->state_).new_inst;
  pIVar12 = (basic_block->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar4 = 0;
  if (pIVar12->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
  }
  local_90._0_4_ = uVar4;
  paVar6 = (array<signed_char,_4UL> *)
           std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[](local_60,(key_type *)local_90);
  *&paVar6->_M_elems = aVar3._M_elems;
  pIVar12 = (basic_block->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar12->has_result_id_ == false) {
LAB_005f88ce:
    __assert_fail("has_result_id_",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                  ,0x2c8,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
  }
  if (aVar3._M_elems == (_Type)0x0) {
LAB_005f88af:
    __assert_fail("res_id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                  ,0x2cd,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
  }
  local_90._24_8_ = local_90 + 0x10;
  local_90._0_8_ = &PTR__SmallVector_009488e0;
  local_70._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_90[0x10] = aVar3._M_elems[0];
  local_90[0x11] = aVar3._M_elems[1];
  local_90[0x12] = aVar3._M_elems[2];
  local_90[0x13] = aVar3._M_elems[3];
  local_90._8_4_ = (array<signed_char,_4UL>)0x1;
  local_90._12_4_ = (array<signed_char,_4UL>)0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)
             (*(long *)&(pIVar12->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl + (ulong)((uint)pIVar12->has_type_id_ * 0x30) + 8),
             (SmallVector<unsigned_int,_2UL> *)local_90);
  local_90._0_8_ = &PTR__SmallVector_009488e0;
  if (local_70._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_70,local_70._M_head_impl);
  }
  analysis::DefUseManager::AnalyzeInstDefUse
            (this_00,(basic_block->label_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                     .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
  pIVar12 = (basic_block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  pIVar9 = &(basic_block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  if (pIVar12 != pIVar9) {
    local_38 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&(this->state_).ids_to_new_inst;
    local_40 = this;
    do {
      pIVar2 = (pIVar12->dbg_line_insts_).
               super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pIVar11 = (pIVar12->dbg_line_insts_).
                     super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                     ._M_impl.super__Vector_impl_data._M_start; pIVar11 != pIVar2;
          pIVar11 = pIVar11 + 1) {
        analysis::DefUseManager::AnalyzeInstDefUse(this_00,pIVar11);
      }
      uVar4 = 0;
      if (pIVar12->has_result_id_ == true) {
        uVar4 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
      }
      local_64 = uVar4;
      if (uVar4 != 0) {
        pIVar1 = this->context_;
        PVar5.data._M_elems =
             (array<signed_char,_4UL>)
             Module::TakeNextIdBound
                       ((pIVar1->module_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                        .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
        if ((PVar5.data._M_elems == (_Type)0x0) &&
           ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
          local_90._0_8_ = local_90 + 0x10;
          local_58.line._0_4_ = (array<signed_char,_4UL>)0x25;
          local_58.line._4_4_ = (array<signed_char,_4UL>)0x0;
          local_90._0_8_ = std::__cxx11::string::_M_create((ulong *)local_90,(ulong)&local_58);
          local_90._16_8_ = local_58.line;
          *(undefined8 *)local_90._0_8_ = 0x667265766f204449;
          *(undefined8 *)(local_90._0_8_ + 8) = 0x797254202e776f6c;
          *(undefined8 *)(local_90._0_8_ + 0x10) = 0x676e696e6e757220;
          *(undefined8 *)(local_90._0_8_ + 0x18) = 0x746361706d6f6320;
          builtin_strncpy((char *)(local_90._0_8_ + 0x1d),"act-ids.",8);
          local_90._8_8_ = local_58.line;
          *(char *)(local_90._0_8_ + local_58.line) = '\0';
          local_58.line = 0;
          local_58.column = 0;
          local_58.index = 0;
          std::
          function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
          operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",&local_58,(char *)local_90._0_8_);
          this = local_40;
          if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
            operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
            this = local_40;
          }
        }
        if (pIVar12->has_result_id_ == false) goto LAB_005f88ce;
        if (PVar5.data._M_elems == (_Type)0x0) goto LAB_005f88af;
        local_90._0_8_ = &PTR__SmallVector_009488e0;
        local_90._24_8_ = local_90 + 0x10;
        local_70._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_90._16_4_ = PVar5.data._M_elems;
        local_90._8_4_ = (array<signed_char,_4UL>)0x1;
        local_90._12_4_ = (array<signed_char,_4UL>)0x0;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)
                   ((long)((((pIVar12->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_start)->words).buffer +
                          0xfffffffffffffffc) + (ulong)((uint)pIVar12->has_type_id_ * 0x30)),
                   (SmallVector<unsigned_int,_2UL> *)local_90);
        local_90._0_8_ = &PTR__SmallVector_009488e0;
        if (local_70._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_70,local_70._M_head_impl);
        }
        analysis::DefUseManager::AnalyzeInstDef(this_00,pIVar12);
        uVar10 = 0;
        uVar4 = 0;
        if (pIVar12->has_result_id_ == true) {
          uVar4 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
        }
        pmVar7 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_60,&local_64);
        *pmVar7 = uVar4;
        pIVar11 = this->loop_induction_variable_;
        if (pIVar11->has_result_id_ == true) {
          uVar10 = Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_);
        }
        if (uVar10 == local_64) {
          (this->state_).new_phi = pIVar12;
        }
        uVar4 = 0;
        if (pIVar12->has_result_id_ == true) {
          uVar4 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
        }
        local_90._0_4_ = uVar4;
        ppIVar8 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[](local_38,(key_type *)local_90);
        *ppIVar8 = pIVar12;
      }
      pIVar12 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar12 != pIVar9);
  }
  return;
}

Assistant:

void LoopUnrollerUtilsImpl::AssignNewResultIds(BasicBlock* basic_block) {
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

  // Label instructions aren't covered by normal traversal of the
  // instructions.
  // TODO(1841): Handle id overflow.
  uint32_t new_label_id = context_->TakeNextId();

  // Assign a new id to the label.
  state_.new_inst[basic_block->GetLabelInst()->result_id()] = new_label_id;
  basic_block->GetLabelInst()->SetResultId(new_label_id);
  def_use_mgr->AnalyzeInstDefUse(basic_block->GetLabelInst());

  for (Instruction& inst : *basic_block) {
    // Do def/use analysis on new lines
    for (auto& line : inst.dbg_line_insts())
      def_use_mgr->AnalyzeInstDefUse(&line);

    uint32_t old_id = inst.result_id();

    // Ignore stores etc.
    if (old_id == 0) {
      continue;
    }

    // Give the instruction a new id.
    // TODO(1841): Handle id overflow.
    inst.SetResultId(context_->TakeNextId());
    def_use_mgr->AnalyzeInstDef(&inst);

    // Save the mapping of old_id -> new_id.
    state_.new_inst[old_id] = inst.result_id();
    // Check if this instruction is the induction variable.
    if (loop_induction_variable_->result_id() == old_id) {
      // Save a pointer to the new copy of it.
      state_.new_phi = &inst;
    }
    state_.ids_to_new_inst[inst.result_id()] = &inst;
  }
}